

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::writeString_abi_cxx11_(Factory *builder,Value *root)

{
  pointer pSVar1;
  undefined8 in_RDX;
  long *in_RSI;
  string *in_RDI;
  StreamWriterPtr writer;
  ostringstream sout;
  string *this;
  undefined1 local_198 [384];
  undefined8 local_18;
  long *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
  (**(code **)(*local_10 + 0x10))();
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)this,
             (pointer)local_198);
  pSVar1 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator->
                     ((unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)
                      0x16c97a);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,local_18,local_198 + 8);
  std::__cxx11::ostringstream::str();
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            ((unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
  return in_RDI;
}

Assistant:

std::string writeString(StreamWriter::Factory const& builder, Value const& root) {
  std::ostringstream sout;
  StreamWriterPtr const writer(builder.newStreamWriter());
  writer->write(root, &sout);
  return sout.str();
}